

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_snake_case(string *__return_storage_ptr__,t_rs_generator *this,string *name)

{
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  string local_68;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *name_local;
  t_rs_generator *this_local;
  string *str;
  
  local_21 = 0;
  local_20 = name;
  name_local = (string *)this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  t_generator::underscore(&local_48,&this->super_t_generator,&local_68);
  t_generator::decapitalize(__return_storage_ptr__,&this->super_t_generator,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"__",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"_",&local_c1);
  string_replace(this,__return_storage_ptr__,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_snake_case(const string& name) {
  string str(decapitalize(underscore(name)));
  string_replace(str, "__", "_");
  return str;
}